

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O3

bool __thiscall ON_Quaternion::Unitize(ON_Quaternion *this)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  bool bVar4;
  double dVar5;
  ON_Quaternion q;
  ON_Quaternion local_38;
  
  dVar5 = Length(this);
  if (dVar5 <= 2.2250738585072014e-308) {
    if (0.0 < dVar5) {
      dVar5 = this->c * 1e+300;
      ON_Quaternion(&local_38,this->a * 1e+300,this->b * 1e+300,dVar5,dVar5);
      bVar4 = Unitize(&local_38);
      if (bVar4) {
        this->a = local_38.a;
        this->b = local_38.b;
        this->c = local_38.c;
        this->d = local_38.d;
        goto LAB_005963d7;
      }
    }
    bVar4 = false;
  }
  else {
    dVar5 = 1.0 / dVar5;
    dVar2 = this->a * dVar5;
    dVar3 = this->b * dVar5;
    auVar1._8_4_ = SUB84(dVar3,0);
    auVar1._0_8_ = dVar2;
    auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
    this->a = dVar2;
    this->b = (double)auVar1._8_8_;
    this->c = this->c * dVar5;
    this->d = this->d * dVar5;
LAB_005963d7:
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool ON_Quaternion::Unitize()
{
  double x = Length();

  if (x > ON_DBL_MIN)
  {
    x = 1.0/x;
    a *= x; b *= x; c *= x; d *= x;
  }
  else if ( x > 0.0 )
  {
    ON_Quaternion q(a*1.0e300,b*1.0e300,c*1.0e300,c*1.0e300);
    if ( !q.Unitize() )
      return false;
    a = q.a; 
    b = q.b;
    c = q.c;
    d = q.d;
  }
  else
  {
    return false;
  }

  return true;
}